

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* reduce_rows_cols(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *__return_storage_ptr__,
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *mtrx,tuple<int,_int> *tpl)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2 = _DAT_00105030;
  lVar3 = (long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
                _M_head_impl;
  pvVar1 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pvVar1[lVar3 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl;
  lVar6 = (long)*(pointer *)
                 ((long)&pvVar1[lVar3 + -1].super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data + 8) - lVar4;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    lVar7 = lVar6 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_00105030;
    auVar10 = _DAT_00105020;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(undefined8 *)(lVar4 + uVar8 * 8) = 0x7ff8000000000000;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(undefined8 *)(lVar4 + 8 + uVar8 * 8) = 0x7ff8000000000000;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
    } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar8);
  }
  lVar4 = (long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
                super__Head_base<1UL,_int,_false>._M_head_impl;
  lVar6 = (long)(mtrx->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    pvVar5 = pvVar1;
    do {
      *(undefined8 *)
       (*(long *)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + -8 + lVar4 * 8) = 0x7ff8000000000000;
      pvVar5 = pvVar5 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  *(undefined8 *)
   (*(long *)&pvVar1[lVar4 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl + -8 +
   lVar3 * 8) = 0x7ff8000000000000;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,mtrx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> reduce_rows_cols(std::vector<std::vector<double>> &mtrx, std::tuple<int,int> &tpl){
    for(int j=0; j< mtrx[std::get<0>(tpl)-1].size(); j++){
        mtrx[std::get<0>(tpl)-1][j] = INF;
    }
    for(int i =0; i<mtrx.size();i++){
        mtrx[i][std::get<1>(tpl)-1] = INF;
    }
    mtrx[std::get<1>(tpl)-1][std::get<0>(tpl)-1] = INF;
    return mtrx;
}